

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode wc_statemach(Curl_easy *data)

{
  WildcardData *pWVar1;
  connectdata *pcVar2;
  ftp_wc *pfVar3;
  undefined8 *puVar4;
  FILEPROTO *pFVar5;
  uchar uVar6;
  CURLcode CVar7;
  char *pcVar8;
  long lVar9;
  ftp_wc *ftpwc_1;
  long userresponse;
  char *tmp_path;
  FTP *ftp;
  curl_fileinfo *finfo;
  ftp_conn *ftpc;
  ftp_wc *ftpwc;
  CURLcode result;
  connectdata *conn;
  WildcardData *wildcard;
  Curl_easy *data_local;
  
  pWVar1 = data->wildcard;
  pcVar2 = data->conn;
  do {
    switch(pWVar1->state) {
    case '\0':
    case '\x06':
    case '\a':
      if (pWVar1->dtor != (wildcard_dtor)0x0) {
        (*pWVar1->dtor)(pWVar1->ftpwc);
        pWVar1->ftpwc = (ftp_wc *)0x0;
      }
      return CURLE_OK;
    case '\x01':
      CVar7 = init_wc_data(data);
      if (pWVar1->state == '\x04') {
        return CVar7;
      }
      uVar6 = '\x02';
      if (CVar7 != CURLE_OK) {
        uVar6 = '\x06';
      }
      pWVar1->state = uVar6;
      return CVar7;
    case '\x02':
      pfVar3 = pWVar1->ftpwc;
      (data->set).fwrite_func = (pfVar3->backup).write_function;
      (data->set).out = (pfVar3->backup).file_descriptor;
      (pfVar3->backup).write_function = (curl_write_callback)0x0;
      (pfVar3->backup).file_descriptor = (FILE *)0x0;
      pWVar1->state = '\x03';
      CVar7 = Curl_ftp_parselist_geterror(pfVar3->parser);
      if (CVar7 == CURLE_OK) {
        if ((pWVar1->filelist).size == 0) {
          pWVar1->state = '\x04';
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
      }
      else {
        pWVar1->state = '\x04';
      }
      break;
    case '\x03':
      puVar4 = (undefined8 *)((pWVar1->filelist).head)->ptr;
      pFVar5 = (data->req).p.file;
      pcVar8 = curl_maprintf("%s%s",pWVar1->path,*puVar4);
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (*Curl_cfree)(pFVar5->freepath);
      pFVar5->path = pcVar8;
      pFVar5->freepath = pcVar8;
      if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(data,"Wildcard - START of \"%s\"",*puVar4);
      }
      if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
        Curl_set_in_callback(data,true);
        lVar9 = (*(data->set).chunk_bgn)
                          (puVar4,(data->set).wildcardptr,(int)(pWVar1->filelist).size);
        Curl_set_in_callback(data,false);
        if (lVar9 == 1) {
          return CURLE_CHUNK_FAILED;
        }
        if (lVar9 == 2) {
          if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          {
            Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar4);
          }
          pWVar1->state = '\x05';
          break;
        }
      }
      if (*(int *)(puVar4 + 1) == 0) {
        if ((*(uint *)(puVar4 + 0xc) & 0x40) != 0) {
          (pcVar2->proto).ftpc.known_filesize = puVar4[5];
        }
        CVar7 = ftp_parse_url_path(data);
        if (CVar7 != CURLE_OK) {
          return CVar7;
        }
        Curl_llist_remove(&pWVar1->filelist,(pWVar1->filelist).head,(void *)0x0);
        if ((pWVar1->filelist).size != 0) {
          return CURLE_OK;
        }
        pWVar1->state = '\x04';
        return CURLE_OK;
      }
      pWVar1->state = '\x05';
      break;
    case '\x04':
      ftpwc._4_4_ = CURLE_OK;
      if (pWVar1->ftpwc != (ftp_wc *)0x0) {
        ftpwc._4_4_ = Curl_ftp_parselist_geterror(pWVar1->ftpwc->parser);
      }
      uVar6 = '\a';
      if (ftpwc._4_4_ != CURLE_OK) {
        uVar6 = '\x06';
      }
      pWVar1->state = uVar6;
      return ftpwc._4_4_;
    case '\x05':
      if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
        Curl_set_in_callback(data,true);
        (*(data->set).chunk_end)((data->set).wildcardptr);
        Curl_set_in_callback(data,false);
      }
      Curl_llist_remove(&pWVar1->filelist,(pWVar1->filelist).head,(void *)0x0);
      uVar6 = '\x03';
      if ((pWVar1->filelist).size == 0) {
        uVar6 = '\x04';
      }
      pWVar1->state = uVar6;
    }
  } while( true );
}

Assistant:

static CURLcode wc_statemach(struct Curl_easy *data)
{
  struct WildcardData * const wildcard = data->wildcard;
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;

  for(;;) {
    switch(wildcard->state) {
    case CURLWC_INIT:
      result = init_wc_data(data);
      if(wildcard->state == CURLWC_CLEAN)
        /* only listing! */
        return result;
      wildcard->state = result ? CURLWC_ERROR : CURLWC_MATCHING;
      return result;

    case CURLWC_MATCHING: {
      /* In this state is LIST response successfully parsed, so lets restore
         previous WRITEFUNCTION callback and WRITEDATA pointer */
      struct ftp_wc *ftpwc = wildcard->ftpwc;
      data->set.fwrite_func = ftpwc->backup.write_function;
      data->set.out = ftpwc->backup.file_descriptor;
      ftpwc->backup.write_function = ZERO_NULL;
      ftpwc->backup.file_descriptor = NULL;
      wildcard->state = CURLWC_DOWNLOADING;

      if(Curl_ftp_parselist_geterror(ftpwc->parser)) {
        /* error found in LIST parsing */
        wildcard->state = CURLWC_CLEAN;
        continue;
      }
      if(wildcard->filelist.size == 0) {
        /* no corresponding file */
        wildcard->state = CURLWC_CLEAN;
        return CURLE_REMOTE_FILE_NOT_FOUND;
      }
      continue;
    }

    case CURLWC_DOWNLOADING: {
      /* filelist has at least one file, lets get first one */
      struct ftp_conn *ftpc = &conn->proto.ftpc;
      struct curl_fileinfo *finfo = wildcard->filelist.head->ptr;
      struct FTP *ftp = data->req.p.ftp;

      char *tmp_path = aprintf("%s%s", wildcard->path, finfo->filename);
      if(!tmp_path)
        return CURLE_OUT_OF_MEMORY;

      /* switch default ftp->path and tmp_path */
      free(ftp->pathalloc);
      ftp->pathalloc = ftp->path = tmp_path;

      infof(data, "Wildcard - START of \"%s\"", finfo->filename);
      if(data->set.chunk_bgn) {
        long userresponse;
        Curl_set_in_callback(data, true);
        userresponse = data->set.chunk_bgn(
          finfo, data->set.wildcardptr, (int)wildcard->filelist.size);
        Curl_set_in_callback(data, false);
        switch(userresponse) {
        case CURL_CHUNK_BGN_FUNC_SKIP:
          infof(data, "Wildcard - \"%s\" skipped by user",
                finfo->filename);
          wildcard->state = CURLWC_SKIP;
          continue;
        case CURL_CHUNK_BGN_FUNC_FAIL:
          return CURLE_CHUNK_FAILED;
        }
      }

      if(finfo->filetype != CURLFILETYPE_FILE) {
        wildcard->state = CURLWC_SKIP;
        continue;
      }

      if(finfo->flags & CURLFINFOFLAG_KNOWN_SIZE)
        ftpc->known_filesize = finfo->size;

      result = ftp_parse_url_path(data);
      if(result)
        return result;

      /* we don't need the Curl_fileinfo of first file anymore */
      Curl_llist_remove(&wildcard->filelist, wildcard->filelist.head, NULL);

      if(wildcard->filelist.size == 0) { /* remains only one file to down. */
        wildcard->state = CURLWC_CLEAN;
        /* after that will be ftp_do called once again and no transfer
           will be done because of CURLWC_CLEAN state */
        return CURLE_OK;
      }
      return result;
    }

    case CURLWC_SKIP: {
      if(data->set.chunk_end) {
        Curl_set_in_callback(data, true);
        data->set.chunk_end(data->set.wildcardptr);
        Curl_set_in_callback(data, false);
      }
      Curl_llist_remove(&wildcard->filelist, wildcard->filelist.head, NULL);
      wildcard->state = (wildcard->filelist.size == 0) ?
        CURLWC_CLEAN : CURLWC_DOWNLOADING;
      continue;
    }

    case CURLWC_CLEAN: {
      struct ftp_wc *ftpwc = wildcard->ftpwc;
      result = CURLE_OK;
      if(ftpwc)
        result = Curl_ftp_parselist_geterror(ftpwc->parser);

      wildcard->state = result ? CURLWC_ERROR : CURLWC_DONE;
      return result;
    }

    case CURLWC_DONE:
    case CURLWC_ERROR:
    case CURLWC_CLEAR:
      if(wildcard->dtor) {
        wildcard->dtor(wildcard->ftpwc);
        wildcard->ftpwc = NULL;
      }
      return result;
    }
  }
  /* UNREACHABLE */
}